

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O3

bool __thiscall ForbiddenPointFinder::isOverline(ForbiddenPointFinder *this,int x,int y)

{
  bool bVar1;
  long lVar2;
  Stone *pSVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  Stone (*paSVar9) [17];
  long lVar10;
  uint uVar11;
  uint uVar12;
  Stone *pSVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  
  lVar2 = (long)(int)(x + 1U);
  if (this->cBoard[lVar2][(long)y + 1] != Empty) {
    return false;
  }
  pSVar3 = this->cBoard[lVar2] + (long)y + 1;
  *pSVar3 = Black;
  if (x < 1) {
    uVar16 = 1;
LAB_00102d62:
    lVar10 = (long)(x + 2);
    iVar4 = uVar16 - x;
    pSVar13 = this->cBoard[lVar10] + (long)y + 1;
    do {
      lVar10 = lVar10 + 1;
      bVar18 = true;
      uVar11 = uVar16;
      if (*pSVar13 != Black) break;
      uVar16 = uVar16 + 1;
      pSVar13 = pSVar13 + 0x11;
      uVar11 = iVar4 + 0xe;
    } while ((int)lVar10 != 0x10);
  }
  else {
    uVar11 = 1;
    uVar7 = x;
    do {
      uVar16 = uVar11;
      if (this->cBoard[uVar7][(long)y + 1] != Black) break;
      uVar7 = uVar7 - 1;
      bVar18 = uVar11 != x;
      uVar11 = uVar11 + 1;
      uVar16 = x + 1U;
    } while (bVar18);
    if (x < 0xe) goto LAB_00102d62;
    bVar18 = false;
    uVar11 = uVar16;
  }
  iVar4 = x + 2;
  if (uVar11 != 5) {
    if (y < 1) {
      uVar16 = 1;
LAB_00102e03:
      iVar17 = uVar16 - y;
      lVar10 = (long)(y + 2) + 0x1c5;
      do {
        bVar19 = true;
        uVar7 = uVar16;
        if (*(int *)((long)this->ptForbidden + lVar10 * 4 + lVar2 * 0x44 + -0xc) != 0x58) break;
        uVar16 = uVar16 + 1;
        iVar14 = (int)lVar10;
        lVar10 = lVar10 + 1;
        uVar7 = iVar17 + 0xe;
      } while (iVar14 != 0x1d4);
    }
    else {
      uVar7 = 1;
      uVar8 = y;
      do {
        uVar16 = uVar7;
        if (this->cBoard[lVar2][uVar8] != Black) break;
        uVar8 = uVar8 - 1;
        bVar19 = uVar7 != y;
        uVar7 = uVar7 + 1;
        uVar16 = y + 1;
      } while (bVar19);
      if (y < 0xe) goto LAB_00102e03;
      bVar19 = false;
      uVar7 = uVar16;
    }
    iVar17 = y + 2;
    if (uVar7 != 5) {
      uVar16 = 1;
      if (0 < x && 0 < y) {
        uVar8 = x - 1U;
        if (y - 1U < x - 1U) {
          uVar8 = y - 1U;
        }
        uVar5 = 1;
        uVar15 = y;
        uVar12 = x;
        do {
          uVar16 = uVar5;
          if (this->cBoard[uVar12][uVar15] != Black) break;
          uVar15 = uVar15 - 1;
          uVar12 = uVar12 - 1;
          iVar14 = uVar5 - uVar8;
          uVar5 = uVar5 + 1;
          uVar16 = uVar8 + 2;
        } while (iVar14 != 1);
      }
      if ((bool)(bVar18 & bVar19)) {
        lVar10 = (long)iVar4;
        pSVar13 = this->cBoard[lVar10] + iVar17;
        lVar2 = (long)iVar17;
        do {
          if ((*pSVar13 != Black) || (uVar16 = uVar16 + 1, 0xe < lVar10)) break;
          lVar10 = lVar10 + 1;
          pSVar13 = pSVar13 + 0x12;
          bVar1 = lVar2 < 0xf;
          lVar2 = lVar2 + 1;
        } while (bVar1);
      }
      if (uVar16 != 5) {
        uVar8 = 1;
        if (bVar19 && 0 < x) {
          lVar2 = 0;
          do {
            if (this->cBoard[(uint)x][iVar17 + lVar2] != Black) {
              uVar8 = (int)lVar2 + 1;
              goto LAB_00102fa4;
            }
            lVar10 = lVar2 + 1;
          } while ((1 < x) && (lVar6 = lVar2 + iVar17, x = x - 1, lVar2 = lVar10, lVar6 < 0xf));
          uVar8 = (int)lVar10 + 1;
        }
LAB_00102fa4:
        if (bVar18 && 0 < y) {
          lVar2 = (long)iVar4;
          paSVar9 = this->cBoard + lVar2;
          do {
            if (((*paSVar9)[(uint)y] != Black) || (uVar8 = uVar8 + 1, 0xe < lVar2)) break;
            lVar2 = lVar2 + 1;
            paSVar9 = paSVar9 + 1;
            bVar18 = 1 < y;
            y = y - 1;
          } while (bVar18);
        }
        if (uVar8 != 5) {
          bVar18 = 5 < uVar8 || ((5 < uVar11 || 5 < uVar7) || 5 < uVar16);
          goto LAB_00102ff4;
        }
      }
    }
  }
  bVar18 = false;
LAB_00102ff4:
  *pSVar3 = Empty;
  return bVar18;
}

Assistant:

bool ForbiddenPointFinder::isOverline(int x, int y) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    setStone(x, y, Stone::Black);

    // detect black overline
    int i, j;
    bool bOverline = false;

    // 1 - horizontal direction
    int nLine = 1;
    i = x;
    while (i > 0) {
        if (cBoard[i--][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[i++][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 2 - vertical direction
    nLine = 1;
    i = y;
    while (i > 0) {
        if (cBoard[x + 1][i--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = y + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[x + 1][i++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 3 - diagonal direction (lower-left to upper-right: '/')
    nLine = 1;
    i = x;
    j = y;
    while ((i > 0) && (j > 0)) {
        if (cBoard[i--][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y + 2;
    while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
        if (cBoard[i++][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 4 - diagonal direction (upper-left to lower-right: '\')
    nLine = 1;
    i = x;
    j = y + 2;
    while ((i > 0) && (j < (BoardSize + 1))) {
        if (cBoard[i--][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y;
    while ((i < (BoardSize + 1)) && (j > 0)) {
        if (cBoard[i++][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    setStone(x, y, Stone::Empty);
    return bOverline;
}